

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O0

base_learner * bs_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  pointer pbVar4;
  ostream *this;
  vector<double,_std::allocator<double>_> *pvVar5;
  base_learner *this_00;
  learner<bs,_example> *this_01;
  id in_RSI;
  long *in_RDI;
  learner<bs,_example> *l;
  option_group_definition new_options;
  string type_string;
  free_ptr<bs> data;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffae8;
  vw *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffaf8;
  single_learner *in_stack_fffffffffffffb00;
  undefined1 *__n;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  option_group_definition *in_stack_fffffffffffffb40;
  allocator local_429;
  string local_428 [32];
  undefined4 local_408;
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [96];
  learner<char,_char> *in_stack_fffffffffffffcb0;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  typed_option<unsigned_int> local_200 [2];
  allocator local_b9;
  string local_b8 [32];
  undefined1 local_98 [79];
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [32];
  AllReduce *local_8;
  
  local_28._16_8_ = in_RSI._M_thread;
  local_28._24_8_ = in_RDI;
  scoped_calloc_or_throw<bs>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"mean",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Bootstrap",&local_b9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffaf0,
             (string *)in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"bootstrap",&local_221);
  std::unique_ptr<bs,_void_(*)(void_*)>::operator->((unique_ptr<bs,_void_(*)(void_*)> *)0x284908);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffaf8,(uint *)in_stack_fffffffffffffaf0)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_200,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_248,"k-way bootstrap by online importance resampling",&local_249);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffaf0,
             (string *)in_stack_fffffffffffffae8);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffaf0,
             (typed_option<unsigned_int> *)in_stack_fffffffffffffae8);
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffffb40,
             (typed_option<unsigned_int> *)
             CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"bs_type",&local_3b1);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffffaf8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaf0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)(local_3b0 + 0x20),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"prediction type {mean,vote}",&local_3d9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffffaf0,(string *)in_stack_fffffffffffffae8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffffb40,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_98);
  uVar1 = local_28._24_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"bootstrap",&local_401);
  bVar2 = (**(code **)(*(long *)uVar1 + 8))(uVar1,local_400);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bs,_void_(*)(void_*)> *)0x284eb5);
    pbVar4->ub = 3.4028235e+38;
    pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bs,_void_(*)(void_*)> *)0x284ec6);
    pbVar4->lb = -3.4028235e+38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"bs_type",&local_429);
    bVar2 = (**(code **)(*(long *)local_28._24_8_ + 8))(local_28._24_8_,local_428);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    if ((bVar2 & 1) == 0) {
      pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                         ((unique_ptr<bs,_void_(*)(void_*)> *)0x285049);
      pbVar4->bs_type = 0;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_48);
      if (iVar3 == 0) {
        pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                           ((unique_ptr<bs,_void_(*)(void_*)> *)0x284f70);
        pbVar4->bs_type = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_48);
        if (iVar3 == 0) {
          pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                             ((unique_ptr<bs,_void_(*)(void_*)> *)0x284fec);
          pbVar4->bs_type = 1;
        }
        else {
          this = std::operator<<((ostream *)&std::cerr,
                                 "warning: bs_type must be in {\'mean\',\'vote\'}; resetting to mean."
                                );
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                             ((unique_ptr<bs,_void_(*)(void_*)> *)0x285030);
          pbVar4->bs_type = 0;
        }
      }
    }
    pvVar5 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x28507a);
    __n = local_28;
    pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bs,_void_(*)(void_*)> *)0x28508c);
    pbVar4->pred_vec = pvVar5;
    pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bs,_void_(*)(void_*)> *)0x28509f);
    pvVar5 = pbVar4->pred_vec;
    std::unique_ptr<bs,_void_(*)(void_*)>::operator->((unique_ptr<bs,_void_(*)(void_*)> *)0x2850b2);
    std::vector<double,_std::allocator<double>_>::reserve(pvVar5,(size_type)__n);
    pbVar4 = std::unique_ptr<bs,_void_(*)(void_*)>::operator->
                       ((unique_ptr<bs,_void_(*)(void_*)> *)0x2850dc);
    pbVar4->all = (vw *)local_28._16_8_;
    this_00 = setup_base((options_i *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    in_stack_fffffffffffffb00 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffcb0);
    in_stack_fffffffffffffaf0 = (vw *)local_28;
    std::unique_ptr<bs,_void_(*)(void_*)>::operator->((unique_ptr<bs,_void_(*)(void_*)> *)0x285124);
    this_01 = LEARNER::init_learner<bs,example,LEARNER::learner<char,example>>
                        ((free_ptr<bs> *)this_00,(learner<char,_example> *)local_28._16_8_,
                         (_func_void_bs_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffb00,
                         (_func_void_bs_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffaf8,(size_t)in_stack_fffffffffffffaf0);
    LEARNER::learner<bs,_example>::set_finish_example(this_01,finish_example);
    LEARNER::learner<bs,_example>::set_finish
              ((learner<bs,_example> *)this_00,(_func_void_bs_ptr *)local_28._16_8_);
    local_8 = (AllReduce *)LEARNER::make_base<bs,example>(this_01);
  }
  else {
    local_8 = (AllReduce *)0x0;
  }
  local_408 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffaf0);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<bs,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<bs,_void_(*)(void_*)> *)in_stack_fffffffffffffb00);
  return (base_learner *)local_8;
}

Assistant:

base_learner* bs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<bs>();
  std::string type_string("mean");
  option_group_definition new_options("Bootstrap");
  new_options.add(make_option("bootstrap", data->B).keep().help("k-way bootstrap by online importance resampling"))
      .add(make_option("bs_type", type_string).keep().help("prediction type {mean,vote}"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("bootstrap"))
    return nullptr;

  data->ub = FLT_MAX;
  data->lb = -FLT_MAX;

  if (options.was_supplied("bs_type"))
  {
    if (type_string.compare("mean") == 0)
      data->bs_type = BS_TYPE_MEAN;
    else if (type_string.compare("vote") == 0)
      data->bs_type = BS_TYPE_VOTE;
    else
    {
      std::cerr << "warning: bs_type must be in {'mean','vote'}; resetting to mean." << std::endl;
      data->bs_type = BS_TYPE_MEAN;
    }
  }
  else  // by default use mean
    data->bs_type = BS_TYPE_MEAN;

  data->pred_vec = new vector<double>();
  data->pred_vec->reserve(data->B);
  data->all = &all;

  learner<bs, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->B);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}